

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementHexaCorot_20::UpdateRotation(ChElementHexaCorot_20 *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  double dVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 uVar21;
  bool bVar22;
  undefined1 uVar23;
  bool bVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar53 [16];
  double dVar49;
  undefined1 auVar54 [16];
  double dVar50;
  undefined1 auVar55 [16];
  double dVar51;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar52;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  double dVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  double dVar91;
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  double dVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  ChMatrix33<double> rotXcurrent;
  ChMatrix33<double> rotX0;
  double local_188;
  double local_158;
  double local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  double *local_f8;
  double *local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  undefined8 local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  undefined8 local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 auVar93 [16];
  
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_98);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_e0);
  dVar80 = local_98 + local_e0;
  dVar91 = local_90 + local_d8;
  dVar49 = local_88 + local_d0;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
  dVar80 = dVar80 + (double)local_f8;
  dVar91 = dVar91 + (double)local_f0;
  dVar49 = dVar49 + local_e8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_50);
  dVar80 = dVar80 + local_50;
  dVar91 = dVar91 + local_48;
  dVar49 = dVar49 + local_40;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_98);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_e0);
  dVar48 = local_98 + local_e0;
  dVar84 = local_90 + local_d8;
  dVar52 = local_88 + local_d0;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
  dVar48 = dVar48 + (double)local_f8;
  dVar84 = dVar84 + (double)local_f0;
  dVar52 = dVar52 + local_e8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_50);
  dVar80 = (dVar48 + local_50) - dVar80;
  dVar91 = (dVar84 + local_48) - dVar91;
  dVar49 = (dVar52 + local_40) - dVar49;
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_98);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_e0);
  local_128._0_8_ = local_98 + local_e0;
  local_158 = local_90 + local_d8;
  local_188 = local_88 + local_d0;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
  local_128._0_8_ = (double)local_128._0_8_ + (double)local_f8;
  local_158 = local_158 + (double)local_f0;
  local_188 = local_188 + local_e8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_50);
  local_128._0_8_ = (double)local_128._0_8_ + local_50;
  local_158 = local_158 + local_48;
  local_188 = local_188 + local_40;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_98);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_e0);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
  local_148 = local_88 + local_d0 + local_e8;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_50);
  local_128._0_8_ = (local_98 + local_e0 + (double)local_f8 + local_50) - (double)local_128._0_8_;
  local_158 = (local_90 + local_d8 + (double)local_f0 + local_48) - local_158;
  local_188 = (local_148 + local_40) - local_188;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar80;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar91 * dVar91;
  auVar33 = vfmadd231sd_fma(auVar33,auVar31,auVar31);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar49;
  auVar33 = vfmadd231sd_fma(auVar33,auVar34,auVar34);
  dVar48 = auVar33._0_8_;
  uVar23 = dVar48 == 0.0;
  uVar21 = dVar48 < 0.0;
  if ((bool)uVar21) {
    auVar63._0_8_ = sqrt(dVar48);
    auVar63._8_56_ = extraout_var;
    auVar33 = auVar63._0_16_;
  }
  else {
    auVar33 = vsqrtsd_avx(auVar33,auVar33);
  }
  vucomisd_avx512f(auVar33);
  bVar24 = (bool)uVar21 || (bool)uVar23;
  dVar48 = 1.0 / auVar33._0_8_;
  dVar91 = (double)((ulong)bVar24 * (long)(dVar48 * dVar91));
  auVar38._0_8_ =
       (double)((ulong)bVar24 * (long)(dVar48 * dVar80) +
               (ulong)(!(bool)uVar21 && !(bool)uVar23) * 0x3ff0000000000000);
  auVar38._8_8_ = 0;
  dVar80 = (double)((ulong)bVar24 * (long)(dVar48 * dVar49));
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar80;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_158 * local_158;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = local_128._0_8_;
  auVar33 = vfmadd231sd_fma(auVar53,auVar99,auVar99);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = local_188;
  auVar33 = vfmadd231sd_fma(auVar33,auVar107,auVar107);
  dVar49 = auVar33._0_8_;
  uVar23 = dVar49 == 0.0;
  uVar21 = dVar49 < 0.0;
  if ((bool)uVar21) {
    auVar64._0_8_ = sqrt(dVar49);
    auVar64._8_56_ = extraout_var_00;
    auVar33 = auVar64._0_16_;
    local_148 = dVar80;
  }
  else {
    auVar33 = vsqrtsd_avx(auVar33,auVar33);
  }
  auVar103 = ZEXT816(0x3ff0000000000000);
  vucomisd_avx512f(auVar33);
  bVar24 = (bool)uVar21 || (bool)uVar23;
  dVar48 = 1.0 / auVar33._0_8_;
  local_128._0_8_ = (double)local_128._0_8_ * dVar48;
  dVar49 = local_158 * dVar48;
  dVar48 = local_188 * dVar48;
  dVar84 = (double)((ulong)bVar24 * (long)dVar49);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar84;
  local_128._8_8_ = 0;
  auVar27._0_8_ =
       (double)((ulong)bVar24 * local_128._0_8_ +
               (ulong)(!(bool)uVar21 && !(bool)uVar23) * 0x3ff0000000000000);
  auVar27._8_8_ = 0;
  dVar52 = (double)((ulong)bVar24 * (long)dVar48);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar52;
  auVar29 = ZEXT816(0) << 0x40;
  if ((((auVar38._0_8_ != 0.0) || (NAN(auVar38._0_8_))) || (dVar91 != 0.0)) || (NAN(dVar91))) {
LAB_006d4909:
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar91 * dVar91;
    auVar31 = vfmadd231sd_fma(auVar54,auVar38,auVar38);
    auVar31 = vfmadd231sd_fma(auVar31,auVar46,auVar46);
    dVar50 = auVar31._0_8_;
    uVar23 = dVar50 == 0.0;
    uVar21 = dVar50 < 0.0;
    if ((bool)uVar21) {
      auVar65._0_8_ = sqrt(dVar50);
      auVar65._8_56_ = extraout_var_01;
      auVar31 = auVar65._0_16_;
      local_158 = auVar27._0_8_;
      local_188 = dVar52;
      local_148 = dVar80;
    }
    else {
      auVar31 = vsqrtsd_avx(auVar31,auVar31);
    }
    vucomisd_avx512f(auVar31);
    bVar24 = (bool)uVar21 || (bool)uVar23;
    dVar50 = 1.0 / auVar31._0_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = (ulong)bVar24 * (long)(dVar91 * dVar50);
    auVar103._8_8_ = 0;
    auVar103._0_8_ =
         (ulong)bVar24 * (long)(auVar38._0_8_ * dVar50) +
         (ulong)(!(bool)uVar21 && !(bool)uVar23) * 0x3ff0000000000000;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (ulong)bVar24 * (long)(dVar80 * dVar50);
  }
  else {
    auVar30 = ZEXT816(0) << 0x40;
    if ((dVar80 != 0.0) || (NAN(dVar80))) goto LAB_006d4909;
  }
  dVar105 = auVar30._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar105 * dVar84;
  auVar31 = vfmsub231sd_fma(auVar73,auVar29,auVar28);
  dVar80 = auVar31._0_8_;
  dVar50 = auVar103._0_8_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar52 * dVar50;
  auVar34 = vfmsub231sd_fma(auVar85,auVar30,auVar27);
  dVar52 = auVar29._0_8_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = auVar27._0_8_ * dVar52;
  auVar38 = vfmsub231sd_fma(auVar92,auVar103,auVar26);
  dVar91 = auVar38._0_8_;
  dVar84 = auVar34._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar84 * dVar84;
  auVar31 = vfmadd231sd_fma(auVar55,auVar31,auVar31);
  auVar31 = vfmadd231sd_fma(auVar31,auVar38,auVar38);
  if (auVar31._0_8_ < 0.0) {
    auVar66._0_8_ = sqrt(auVar31._0_8_);
    auVar66._8_56_ = extraout_var_02;
    auVar31 = auVar66._0_16_;
    local_158 = dVar80;
    local_188 = dVar84;
    local_148 = dVar91;
  }
  else {
    auVar31 = vsqrtsd_avx(auVar31,auVar31);
  }
  local_138._8_8_ = 0x8000000000000000;
  local_138._0_8_ = 0x8000000000000000;
  dVar51 = auVar31._0_8_;
  bVar24 = dVar51 == 0.0001;
  bVar22 = 0.0001 < dVar51;
  if (dVar51 < 0.0001) {
    vucomisd_avx512f(auVar33);
    if (dVar51 < 0.0001) {
LAB_006d4ac7:
      vucomisd_avx512f(auVar33);
      auVar31 = ZEXT816(0x3ff0000000000000);
      auVar32 = ZEXT816(0) << 0x40;
      if (bVar22 || bVar24) {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar49;
        auVar14._8_8_ = 0x7fffffffffffffff;
        auVar14._0_8_ = 0x7fffffffffffffff;
        auVar38 = vandpd_avx512vl(auVar18,auVar14);
        auVar34 = ZEXT816(0) << 0x40;
        if (0.9 <= auVar38._0_8_) {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar48;
          auVar15._8_8_ = 0x7fffffffffffffff;
          auVar15._0_8_ = 0x7fffffffffffffff;
          auVar31 = vandpd_avx512vl(auVar16,auVar15);
          uVar8 = vcmppd_avx512vl(auVar31,ZEXT816(0x3feccccccccccccd),5);
          uVar9 = vcmppd_avx512vl(auVar33,ZEXT816(0x10000000000000),5);
          auVar31 = ZEXT816(0);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = (ulong)!(bool)((byte)uVar9 & 3 & (byte)uVar8 & 3 & 1) * 0x3ff0000000000000
          ;
        }
      }
      else {
        auVar34 = ZEXT816(0) << 0x40;
      }
    }
    else {
      auVar10._8_8_ = 0x7fffffffffffffff;
      auVar10._0_8_ = 0x7fffffffffffffff;
      auVar31 = vandpd_avx512vl(local_128,auVar10);
      dVar80 = auVar31._0_8_;
      bVar24 = dVar80 == 0.9;
      bVar22 = 0.9 < dVar80;
      if (0.9 <= dVar80) goto LAB_006d4ac7;
      auVar34 = ZEXT816(0x3ff0000000000000);
      auVar32 = ZEXT816(0);
      auVar31 = ZEXT816(0) << 0x40;
    }
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auVar31._0_8_ * -dVar105;
    auVar33 = vfmadd231sd_fma(auVar74,auVar29,auVar32);
    dVar80 = auVar33._0_8_;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = auVar32._0_8_ * -dVar50;
    auVar38 = vfmadd231sd_fma(auVar86,auVar30,auVar34);
    dVar84 = auVar38._0_8_;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = auVar34._0_8_ * -dVar52;
    auVar31 = vfmadd231sd_fma(auVar93,auVar103,auVar31);
    dVar91 = auVar31._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar84 * dVar84;
    auVar33 = vfmadd231sd_fma(auVar56,auVar33,auVar33);
    auVar33 = vfmadd231sd_fma(auVar33,auVar31,auVar31);
    if (auVar33._0_8_ < 0.0) {
      auVar67._0_8_ = sqrt(auVar33._0_8_);
      auVar67._8_56_ = extraout_var_03;
      auVar31 = auVar67._0_16_;
      local_158 = dVar80;
      local_188 = dVar84;
      local_148 = dVar91;
    }
    else {
      auVar31 = vsqrtsd_avx(auVar33,auVar33);
    }
  }
  auVar33 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar31);
  local_58 = auVar33._0_8_;
  local_88 = dVar80 * local_58;
  local_70 = dVar84 * local_58;
  local_58 = dVar91 * local_58;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_70;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar52 * local_58;
  auVar33 = vfmsub231sd_fma(auVar81,auVar75,auVar30);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_58;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar105 * local_88;
  auVar31 = vfmsub231sd_fma(auVar87,auVar57,auVar103);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_88;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar50 * local_70;
  auVar34 = vfmsub231sd_fma(auVar94,auVar71,auVar29);
  local_90 = auVar33._0_8_;
  local_78 = auVar31._0_8_;
  local_60 = auVar34._0_8_;
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar84 = *(double *)((long)&peVar2->super_ChNodeFEAbase + 0x20) +
           *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  dVar51 = *(double *)&peVar2->field_0x28 + *(double *)&peVar3->field_0x28;
  dVar7 = *(double *)&peVar2->field_0x30 + *(double *)&peVar3->field_0x30;
  peVar2 = psVar1[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar80 = *(double *)((long)&peVar2->super_ChNodeFEAbase + 0x20);
  peVar3 = psVar1[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar91 = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  peVar4 = psVar1[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar5 = psVar1[5].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar49 = *(double *)((long)&peVar4->super_ChNodeFEAbase + 0x20);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar49;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(double *)&peVar4->field_0x28;
  dVar48 = *(double *)((long)&peVar5->super_ChNodeFEAbase + 0x20);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dVar48;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(double *)&peVar5->field_0x28;
  auVar33 = vaddsd_avx512f(auVar108,auVar110);
  auVar31 = vaddsd_avx512f(auVar109,auVar111);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)&peVar4->field_0x30;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)&peVar5->field_0x30;
  auVar34 = vaddsd_avx512f(auVar112,auVar113);
  peVar6 = psVar1[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)((long)&peVar6->super_ChNodeFEAbase + 0x20);
  auVar33 = vaddsd_avx512f(auVar33,auVar114);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)&peVar6->field_0x28;
  auVar31 = vaddsd_avx512f(auVar31,auVar115);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)&peVar6->field_0x30;
  auVar34 = vaddsd_avx512f(auVar34,auVar116);
  peVar6 = psVar1[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)((long)&peVar6->super_ChNodeFEAbase + 0x20);
  auVar33 = vaddsd_avx512f(auVar33,auVar117);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar91 + dVar84 + dVar80;
  auVar35 = vsubsd_avx512f(auVar33,auVar95);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)&peVar6->field_0x28;
  auVar33 = vaddsd_avx512f(auVar31,auVar118);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(double *)&peVar3->field_0x28 + dVar51 + *(double *)&peVar2->field_0x28;
  auVar36 = vsubsd_avx512f(auVar33,auVar100);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(double *)&peVar6->field_0x30;
  auVar33 = vaddsd_avx512f(auVar34,auVar96);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar7 + *(double *)&peVar2->field_0x30 + *(double *)&peVar3->field_0x30;
  auVar37 = vsubsd_avx512f(auVar33,auVar106);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar7;
  auVar33 = vaddsd_avx512f(auVar76,auVar112);
  auVar33 = vaddsd_avx512f(auVar33,auVar113);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar91 + dVar80;
  auVar31 = vaddsd_avx512f(auVar82,auVar114);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(double *)&peVar3->field_0x28 + *(double *)&peVar2->field_0x28;
  auVar34 = vaddsd_avx512f(auVar88,auVar115);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(double *)&peVar3->field_0x30 + *(double *)&peVar2->field_0x30;
  auVar38 = vaddsd_avx512f(auVar101,auVar116);
  auVar31 = vaddsd_avx512f(auVar31,auVar117);
  dVar80 = auVar31._0_8_ - (dVar48 + dVar49 + dVar84);
  auVar31 = vaddsd_avx512f(auVar34,auVar118);
  dVar91 = auVar31._0_8_ -
           (*(double *)&peVar5->field_0x28 + *(double *)&peVar4->field_0x28 + dVar51);
  dVar49 = (auVar38._0_8_ + *(double *)&peVar6->field_0x30) - auVar33._0_8_;
  auVar33 = vmulsd_avx512f(auVar36,auVar36);
  auVar33 = vfmadd231sd_avx512f(auVar33,auVar35,auVar35);
  auVar33 = vfmadd231sd_avx512f(auVar33,auVar37,auVar37);
  dVar48 = auVar33._0_8_;
  uVar23 = dVar48 == 0.0;
  uVar21 = dVar48 < 0.0;
  local_98 = dVar50;
  local_80 = dVar52;
  local_68 = dVar105;
  if ((bool)uVar21) {
    vmovsd_avx512f(auVar35);
    vmovsd_avx512f(auVar36);
    vmovsd_avx512f(auVar37);
    auVar68._0_8_ = sqrt(dVar48);
    auVar68._8_56_ = extraout_var_04;
    auVar33 = auVar68._0_16_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_148;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_188;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_158;
  }
  else {
    auVar33 = vsqrtsd_avx(auVar33,auVar33);
  }
  vucomisd_avx512f(auVar33);
  bVar24 = (bool)uVar21 || (bool)uVar23;
  auVar33 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar33);
  auVar31 = vmulsd_avx512f(auVar35,auVar33);
  auVar34 = vmulsd_avx512f(auVar36,auVar33);
  auVar33 = vmulsd_avx512f(auVar37,auVar33);
  dVar48 = (double)((ulong)bVar24 * auVar34._0_8_);
  auVar39._0_8_ =
       (double)((ulong)bVar24 * auVar31._0_8_ +
               (ulong)(!(bool)uVar21 && !(bool)uVar23) * 0x3ff0000000000000);
  auVar39._8_8_ = 0;
  dVar84 = (double)((ulong)bVar24 * auVar33._0_8_);
  auVar40._8_8_ = auVar33._8_8_;
  auVar40._0_8_ = dVar84;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar91 * dVar91;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar80;
  auVar33 = vfmadd231sd_fma(auVar58,auVar104,auVar104);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar49;
  auVar33 = vfmadd231sd_fma(auVar33,auVar102,auVar102);
  dVar52 = auVar33._0_8_;
  uVar23 = dVar52 == 0.0;
  uVar21 = dVar52 < 0.0;
  if ((bool)uVar21) {
    auVar69._0_8_ = sqrt(dVar52);
    auVar69._8_56_ = extraout_var_05;
    auVar33 = auVar69._0_16_;
  }
  else {
    auVar33 = vsqrtsd_avx(auVar33,auVar33);
  }
  uVar25 = 0x3ff0000000000000;
  vucomisd_avx512f(auVar33);
  bVar24 = (bool)uVar21 || (bool)uVar23;
  auVar31 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar33);
  dVar52 = auVar31._0_8_;
  dVar80 = dVar80 * dVar52;
  local_38 = dVar49 * dVar52;
  dVar49 = (double)((ulong)bVar24 * (long)(dVar91 * dVar52));
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar49;
  auVar42._0_8_ =
       (double)((ulong)bVar24 * (long)dVar80 +
               (ulong)(!(bool)uVar21 && !(bool)uVar23) * 0x3ff0000000000000);
  auVar42._8_8_ = 0;
  uStack_30 = 0;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = (ulong)bVar24 * (long)local_38;
  auVar44 = ZEXT816(0) << 0x40;
  if (((auVar39._0_8_ != 0.0) || (NAN(auVar39._0_8_))) || ((dVar48 != 0.0 || (NAN(dVar48))))) {
LAB_006d4f80:
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar48 * dVar48;
    auVar31 = vfmadd231sd_fma(auVar59,auVar39,auVar39);
    auVar31 = vfmadd231sd_fma(auVar31,auVar40,auVar40);
    dVar50 = auVar31._0_8_;
    uVar23 = dVar50 == 0.0;
    uVar21 = dVar50 < 0.0;
    if ((bool)uVar21) {
      auVar70._0_8_ = sqrt(dVar50);
      auVar70._8_56_ = extraout_var_06;
      auVar31 = auVar70._0_16_;
    }
    else {
      auVar31 = vsqrtsd_avx(auVar31,auVar31);
    }
    vucomisd_avx512f(auVar31);
    bVar24 = (bool)uVar21 || (bool)uVar23;
    auVar31 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar31);
    dVar50 = auVar31._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = (ulong)bVar24 * (long)(dVar48 * dVar50);
    uVar25 = (ulong)bVar24 * (long)(auVar39._0_8_ * dVar50) +
             (ulong)(!(bool)uVar21 && !(bool)uVar23) * 0x3ff0000000000000;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = (ulong)bVar24 * (long)(dVar84 * dVar50);
  }
  else {
    auVar45 = ZEXT816(0) << 0x40;
    if ((dVar84 != 0.0) || (NAN(dVar84))) goto LAB_006d4f80;
  }
  dVar105 = auVar45._0_8_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar105 * dVar49;
  auVar31 = vfmsub231sd_fma(auVar77,auVar44,auVar43);
  dVar49 = auVar31._0_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar25;
  auVar34 = vmulsd_avx512f(auVar43,auVar119);
  auVar34 = vfmsub231sd_fma(auVar34,auVar45,auVar42);
  dVar50 = auVar44._0_8_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = auVar42._0_8_ * dVar50;
  auVar38 = vfmsub231sd_avx512f(auVar97,auVar119,auVar41);
  dVar48 = auVar38._0_8_;
  dVar84 = auVar34._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar84 * dVar84;
  auVar31 = vfmadd231sd_fma(auVar60,auVar31,auVar31);
  auVar31 = vfmadd231sd_fma(auVar31,auVar38,auVar38);
  if (auVar31._0_8_ < 0.0) {
    local_a0 = sqrt(auVar31._0_8_);
  }
  else {
    auVar31 = vsqrtsd_avx(auVar31,auVar31);
    local_a0 = auVar31._0_8_;
  }
  bVar24 = local_a0 == 0.0001;
  bVar22 = 0.0001 < local_a0;
  if (0.0001 <= local_a0) goto LAB_006d524e;
  auVar31 = vxorpd_avx512vl(auVar119,local_138);
  vucomisd_avx512f(auVar33);
  if (local_a0 < 0.0001) {
LAB_006d513f:
    vucomisd_avx512f(auVar33);
    auVar34 = ZEXT816(0x3ff0000000000000);
    auVar47 = ZEXT816(0) << 0x40;
    if (bVar22 || bVar24) {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar91 * dVar52;
      auVar12._8_8_ = 0x7fffffffffffffff;
      auVar12._0_8_ = 0x7fffffffffffffff;
      auVar46 = vandpd_avx512vl(auVar17,auVar12);
      auVar38 = ZEXT816(0) << 0x40;
      if (0.9 <= auVar46._0_8_) {
        auVar20._8_8_ = uStack_30;
        auVar20._0_8_ = local_38;
        auVar13._8_8_ = 0x7fffffffffffffff;
        auVar13._0_8_ = 0x7fffffffffffffff;
        auVar34 = vandpd_avx512vl(auVar20,auVar13);
        uVar8 = vcmppd_avx512vl(auVar34,ZEXT816(0x3feccccccccccccd),5);
        uVar9 = vcmppd_avx512vl(auVar33,ZEXT816(0x10000000000000),5);
        auVar34 = ZEXT816(0);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = (ulong)!(bool)((byte)uVar9 & 3 & (byte)uVar8 & 3 & 1) * 0x3ff0000000000000;
      }
    }
    else {
      auVar38 = ZEXT816(0) << 0x40;
    }
  }
  else {
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar80;
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    auVar34 = vandpd_avx512vl(auVar19,auVar11);
    dVar80 = auVar34._0_8_;
    bVar24 = dVar80 == 0.9;
    bVar22 = 0.9 < dVar80;
    if (0.9 <= dVar80) goto LAB_006d513f;
    auVar38 = ZEXT816(0x3ff0000000000000);
    auVar47 = ZEXT816(0);
    auVar34 = ZEXT816(0) << 0x40;
  }
  auVar78._8_8_ = 0;
  auVar78._0_8_ = auVar34._0_8_ * -dVar105;
  auVar33 = vfmadd231sd_fma(auVar78,auVar44,auVar47);
  dVar49 = auVar33._0_8_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar47._0_8_ * auVar31._0_8_;
  auVar31 = vfmadd231sd_fma(auVar89,auVar45,auVar38);
  dVar84 = auVar31._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = auVar38._0_8_ * -dVar50;
  auVar31 = vfmadd231sd_avx512f(auVar98,auVar119,auVar34);
  dVar48 = auVar31._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar84 * dVar84;
  auVar33 = vfmadd231sd_fma(auVar61,auVar33,auVar33);
  auVar33 = vfmadd231sd_fma(auVar33,auVar31,auVar31);
  if (auVar33._0_8_ < 0.0) {
    local_a0 = sqrt(auVar33._0_8_);
  }
  else {
    auVar33 = vsqrtsd_avx(auVar33,auVar33);
    local_a0 = auVar33._0_8_;
  }
LAB_006d524e:
  local_a0 = 1.0 / local_a0;
  local_d0 = dVar49 * local_a0;
  local_b8 = dVar84 * local_a0;
  local_a0 = dVar48 * local_a0;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_b8;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar50 * local_a0;
  auVar33 = vfmsub231sd_fma(auVar83,auVar79,auVar45);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_a0;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar105 * local_d0;
  auVar34 = vfmsub231sd_avx512f(auVar90,auVar62,auVar119);
  auVar31 = vmulsd_avx512f(auVar119,auVar79);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_d0;
  auVar31 = vfmsub231sd_fma(auVar31,auVar72,auVar44);
  vmovsd_avx512f(auVar119);
  local_d8 = auVar33._0_8_;
  local_c0 = auVar34._0_8_;
  local_a8 = auVar31._0_8_;
  local_f8 = &local_e0;
  local_f0 = &local_98;
  local_c8 = dVar50;
  local_b0 = dVar105;
  ChMatrix33<double>::operator=
            (&(this->super_ChElementCorotational).A,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
              *)&local_f8);
  return;
}

Assistant:

void ChElementHexaCorot_20::UpdateRotation() {
    ChVector<> avgX1;
    avgX1 = nodes[0]->GetX0() + nodes[1]->GetX0() + nodes[2]->GetX0() + nodes[3]->GetX0();
    ChVector<> avgX2;
    avgX2 = nodes[4]->GetX0() + nodes[5]->GetX0() + nodes[6]->GetX0() + nodes[7]->GetX0();
    ChVector<> Xdir = avgX2 - avgX1;

    ChVector<> avgY1;
    avgY1 = nodes[0]->GetX0() + nodes[1]->GetX0() + nodes[4]->GetX0() + nodes[5]->GetX0();
    ChVector<> avgY2;
    avgY2 = nodes[2]->GetX0() + nodes[3]->GetX0() + nodes[6]->GetX0() + nodes[7]->GetX0();
    ChVector<> Ydir = avgY2 - avgY1;
    ChMatrix33<> rotX0;
    rotX0.Set_A_Xdir(Xdir.GetNormalized(), Ydir.GetNormalized());

    avgX1 = nodes[0]->pos + nodes[1]->pos + nodes[2]->pos + nodes[3]->pos;
    avgX2 = nodes[4]->pos + nodes[5]->pos + nodes[6]->pos + nodes[7]->pos;
    Xdir = avgX2 - avgX1;

    avgY1 = nodes[0]->pos + nodes[1]->pos + nodes[4]->pos + nodes[5]->pos;
    avgY2 = nodes[2]->pos + nodes[3]->pos + nodes[6]->pos + nodes[7]->pos;
    Ydir = avgY2 - avgY1;
    ChMatrix33<> rotXcurrent;
    rotXcurrent.Set_A_Xdir(Xdir.GetNormalized(), Ydir.GetNormalized());

    this->A = rotXcurrent * rotX0.transpose();
}